

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elements.c
# Opt level: O0

int wally_asset_unblind_with_nonce
              (uchar *nonce_hash,size_t nonce_hash_len,uchar *proof,size_t proof_len,
              uchar *commitment,size_t commitment_len,uchar *extra,size_t extra_len,uchar *generator
              ,size_t generator_len,uchar *asset_out,size_t asset_out_len,uchar *abf_out,
              size_t abf_out_len,uchar *vbf_out,size_t vbf_out_len,uint64_t *value_out)

{
  int iVar1;
  secp256k1_context *ctx_00;
  int local_154;
  int ret;
  uint64_t max_value;
  uint64_t min_value;
  size_t message_len;
  uchar message [64];
  undefined1 local_f0 [8];
  secp256k1_pedersen_commitment commit;
  secp256k1_generator gen;
  secp256k1_context *ctx;
  size_t commitment_len_local;
  uchar *commitment_local;
  size_t proof_len_local;
  uchar *proof_local;
  size_t nonce_hash_len_local;
  uchar *nonce_hash_local;
  
  ctx_00 = secp_ctx();
  min_value = 0x40;
  local_154 = -2;
  if (ctx_00 == (secp256k1_context *)0x0) {
    nonce_hash_local._4_4_ = -3;
  }
  else {
    if (((((((nonce_hash != (uchar *)0x0) && (nonce_hash_len == 0x20)) && (proof != (uchar *)0x0))
          && (((proof_len != 0 &&
               (iVar1 = get_commitment(ctx_00,commitment,commitment_len,
                                       (secp256k1_pedersen_commitment *)local_f0), iVar1 == 0)) &&
              ((extra_len == 0 || (extra != (uchar *)0x0)))))) &&
         ((iVar1 = get_generator(ctx_00,generator,generator_len,
                                 (secp256k1_generator *)(commit.data + 0x38)), iVar1 == 0 &&
          (asset_out != (uchar *)0x0)))) &&
        ((asset_out_len == 0x20 &&
         ((((abf_out != (uchar *)0x0 && (abf_out_len == 0x20)) && (vbf_out != (uchar *)0x0)) &&
          ((vbf_out_len == 0x20 && (value_out != (uint64_t *)0x0)))))))) &&
       (iVar1 = secp256k1_rangeproof_rewind
                          (ctx_00,vbf_out,value_out,(uchar *)&message_len,&min_value,nonce_hash,
                           &max_value,(uint64_t *)&stack0xfffffffffffffeb0,
                           (secp256k1_pedersen_commitment *)local_f0,proof,proof_len,extra,extra_len
                           ,(secp256k1_generator *)(commit.data + 0x38)), iVar1 != 0)) {
      *(size_t *)asset_out = message_len;
      *(undefined8 *)(asset_out + 8) = message._0_8_;
      *(undefined8 *)(asset_out + 0x10) = message._8_8_;
      *(undefined8 *)(asset_out + 0x18) = message._16_8_;
      *(undefined8 *)abf_out = message._24_8_;
      *(undefined8 *)(abf_out + 8) = message._32_8_;
      *(undefined8 *)(abf_out + 0x10) = message._40_8_;
      *(undefined8 *)(abf_out + 0x18) = message._48_8_;
      local_154 = 0;
    }
    wally_clear_3(commit.data + 0x38,0x40,local_f0,0x40,&message_len,0x40);
    nonce_hash_local._4_4_ = local_154;
  }
  return nonce_hash_local._4_4_;
}

Assistant:

int wally_asset_unblind_with_nonce(const unsigned char *nonce_hash, size_t nonce_hash_len,
                                   const unsigned char *proof, size_t proof_len,
                                   const unsigned char *commitment, size_t commitment_len,
                                   const unsigned char *extra, size_t extra_len,
                                   const unsigned char *generator, size_t generator_len,
                                   unsigned char *asset_out, size_t asset_out_len,
                                   unsigned char *abf_out, size_t abf_out_len,
                                   unsigned char *vbf_out, size_t vbf_out_len,
                                   uint64_t *value_out)
{
    const secp256k1_context *ctx = secp_ctx();
    secp256k1_generator gen;
    secp256k1_pedersen_commitment commit;
    unsigned char message[ASSET_TAG_LEN * 2];
    size_t message_len = sizeof(message);
    uint64_t min_value, max_value;
    int ret = WALLY_EINVAL;

    if (!ctx)
        return WALLY_ENOMEM;

    if (!nonce_hash || nonce_hash_len != SHA256_LEN ||
        !proof || !proof_len ||
        get_commitment(ctx, commitment, commitment_len, &commit) != WALLY_OK ||
        (extra_len && !extra) ||
        get_generator(ctx, generator, generator_len, &gen) != WALLY_OK ||
        !asset_out || asset_out_len != ASSET_TAG_LEN ||
        !abf_out || abf_out_len != BLINDING_FACTOR_LEN ||
        !vbf_out || vbf_out_len != BLINDING_FACTOR_LEN || !value_out)
        goto cleanup;

    /* Extract the value blinding factor, value and message from the rangeproof */
    if (!secp256k1_rangeproof_rewind(ctx, vbf_out, value_out,
                                     message, &message_len,
                                     nonce_hash, &min_value, &max_value,
                                     &commit, proof, proof_len,
                                     extra, extra_len,
                                     &gen))
        goto cleanup;

    /* FIXME: check results per blind.cpp */

    /* Extract the asset id and asset blinding factor from the message */
    memcpy(asset_out, message, ASSET_TAG_LEN);
    memcpy(abf_out, message + ASSET_TAG_LEN, ASSET_TAG_LEN);
    ret = WALLY_OK;

cleanup:
    wally_clear_3(&gen, sizeof(gen), &commit, sizeof(commit),
                  message, sizeof(message));
    return ret;
}